

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

wchar_t * fmt::v5::internal::
          format_decimal<unsigned_int,wchar_t,fmt::v5::internal::add_thousands_sep<wchar_t>>
                    (wchar_t *buffer,uint value,int num_digits,
                    add_thousands_sep<wchar_t> thousands_sep)

{
  wchar_t *pwVar1;
  bool bVar2;
  assertion_failure *this;
  ulong uVar3;
  wchar_t *pwVar4;
  uint uVar5;
  wchar_t wVar6;
  
  if (-1 < num_digits) {
    pwVar1 = buffer + (uint)num_digits;
    pwVar4 = pwVar1;
    uVar5 = value;
    if (99 < value) {
      do {
        value = uVar5 / 100;
        uVar3 = (ulong)((uVar5 % 100) * 2);
        pwVar4[-1] = (int)(char)basic_data<void>::DIGITS[uVar3 + 1];
        pwVar4 = pwVar4 + -1;
        if ((thousands_sep.digit_index_ + 1) * -0x55555555 < 0x55555556) {
          pwVar4 = pwVar4 + -thousands_sep.sep_.size_;
          if (thousands_sep.sep_.size_ != 0) {
            memmove(pwVar4,thousands_sep.sep_.data_,thousands_sep.sep_.size_ * 4);
          }
        }
        pwVar4[-1] = (int)(char)basic_data<void>::DIGITS[uVar3];
        pwVar4 = pwVar4 + -1;
        thousands_sep.digit_index_ = thousands_sep.digit_index_ + 2;
        if (thousands_sep.digit_index_ * -0x55555555 < 0x55555556) {
          pwVar4 = pwVar4 + -thousands_sep.sep_.size_;
          if (thousands_sep.sep_.size_ != 0) {
            memmove(pwVar4,thousands_sep.sep_.data_,thousands_sep.sep_.size_ * 4);
          }
        }
        bVar2 = 9999 < uVar5;
        uVar5 = value;
      } while (bVar2);
    }
    if (value < 10) {
      wVar6 = value | 0x30;
    }
    else {
      pwVar4[-1] = (int)(char)basic_data<void>::DIGITS[((ulong)value * 2 & 0xffffffff) + 1];
      pwVar4 = pwVar4 + -1;
      if ((thousands_sep.digit_index_ + 1) * -0x55555555 < 0x55555556) {
        pwVar4 = pwVar4 + -thousands_sep.sep_.size_;
        if (thousands_sep.sep_.size_ != 0) {
          memmove(pwVar4,thousands_sep.sep_.data_,thousands_sep.sep_.size_ * 4);
        }
      }
      wVar6 = (wchar_t)(char)basic_data<void>::DIGITS[(ulong)value * 2];
    }
    pwVar4[-1] = wVar6;
    return pwVar1;
  }
  this = (assertion_failure *)__cxa_allocate_exception(0x10);
  assertion_failure::assertion_failure(this,"invalid digit count");
  __cxa_throw(this,&assertion_failure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, int num_digits,
                            ThousandsSep thousands_sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
    thousands_sep(buffer);
    *--buffer = static_cast<Char>(data::DIGITS[index]);
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<Char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
  thousands_sep(buffer);
  *--buffer = static_cast<Char>(data::DIGITS[index]);
  return end;
}